

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_append_string_with_len(JSON_Array *array,char *string,size_t len)

{
  JSON_Status JVar1;
  JSON_Value *value_00;
  JSON_Value *value;
  size_t len_local;
  char *string_local;
  JSON_Array *array_local;
  
  value_00 = json_value_init_string_with_len(string,len);
  if (value_00 == (JSON_Value *)0x0) {
    array_local._4_4_ = -1;
  }
  else {
    JVar1 = json_array_append_value(array,value_00);
    if (JVar1 == 0) {
      array_local._4_4_ = 0;
    }
    else {
      json_value_free(value_00);
      array_local._4_4_ = -1;
    }
  }
  return array_local._4_4_;
}

Assistant:

JSON_Status json_array_append_string_with_len(JSON_Array *array, const char *string, size_t len) {
    JSON_Value *value = json_value_init_string_with_len(string, len);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_array_append_value(array, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}